

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O0

void __thiscall CSHA1::ReportHash(CSHA1 *this,char *szReport,uchar uReportType)

{
  char local_38 [8];
  char szTemp [16];
  byte local_1a;
  uchar i;
  uchar uReportType_local;
  char *szReport_local;
  CSHA1 *this_local;
  
  if (szReport != (char *)0x0) {
    if (uReportType == '\0') {
      sprintf(local_38,"%02X",(ulong)this->m_digest[0]);
      strcat(szReport,local_38);
      for (local_1a = 1; local_1a < 0x14; local_1a = local_1a + 1) {
        sprintf(local_38," %02X",(ulong)this->m_digest[local_1a]);
        strcat(szReport,local_38);
      }
    }
    else if (uReportType == '\x01') {
      sprintf(local_38,"%u",(ulong)this->m_digest[0]);
      strcat(szReport,local_38);
      for (local_1a = 1; local_1a < 0x14; local_1a = local_1a + 1) {
        sprintf(local_38," %u",(ulong)this->m_digest[local_1a]);
        strcat(szReport,local_38);
      }
    }
    else {
      strcpy(szReport,"Error: Unknown report type!");
    }
  }
  return;
}

Assistant:

void CSHA1::ReportHash(char *szReport, unsigned char uReportType)
{
	unsigned char i;
	char szTemp[16];

	if(szReport == NULL) return;

	if(uReportType == REPORT_HEX)
	{
		sprintf(szTemp, "%02X", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %02X", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else if(uReportType == REPORT_DIGIT)
	{
		sprintf(szTemp, "%u", m_digest[0]);
		strcat(szReport, szTemp);

		for(i = 1; i < 20; i++)
		{
			sprintf(szTemp, " %u", m_digest[i]);
			strcat(szReport, szTemp);
		}
	}
	else strcpy(szReport, "Error: Unknown report type!");
}